

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_4::Array2D<Imf_3_4::Array2D<float>_>::resizeErase
          (Array2D<Imf_3_4::Array2D<float>_> *this,long sizeX,long sizeY)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  Array2D<float> *pAVar8;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong uVar9;
  Array2D<float> *tmp;
  Array2D<float> *in_stack_ffffffffffffff60;
  Array2D<float> *local_60;
  
  uVar4 = in_RSI * in_RDX;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar9 = uVar5 + 8;
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar9);
  *puVar6 = uVar4;
  pAVar8 = (Array2D<float> *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_60 = pAVar8;
    do {
      Array2D<float>::Array2D(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pAVar8 + uVar4);
  }
  lVar1 = in_RDI[2];
  if (lVar1 != 0) {
    lVar2 = *(long *)(lVar1 + -8);
    for (lVar7 = lVar1 + lVar2 * 0x18; lVar1 != lVar7; lVar7 = lVar7 + -0x18) {
      Array2D<float>::~Array2D(in_stack_ffffffffffffff60);
    }
    operator_delete__((void *)(lVar1 + -8),lVar2 * 0x18 + 8);
  }
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = (long)pAVar8;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}